

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
::resetWith(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
            *this,SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                  *other)

{
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  *this_00;
  element_type *peVar1;
  OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void> *in_RSI
  ;
  OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void> *in_RDI
  ;
  shared_ptr<supermap::io::FileManager> thisFileManager;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  *in_stack_ffffffffffffff18;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  *in_stack_ffffffffffffff20;
  path *this_01;
  string_type *__source;
  path *in_stack_ffffffffffffff50;
  undefined1 local_90 [40];
  string_type local_68;
  undefined1 local_48 [72];
  
  this_00 = (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
             *)OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
               ::getRegister(in_RSI);
  OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>::
  getRegister(in_RDI);
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  ::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  getFileManager(this_00);
  peVar1 = std::
           __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1fddde);
  __source = &local_68;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path
            (in_stack_ffffffffffffff50,__source,(format)((ulong)peVar1 >> 0x38));
  this_01 = (path *)&stack0xffffffffffffff50;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path
            (in_stack_ffffffffffffff50,__source,(format)((ulong)peVar1 >> 0x38));
  (*peVar1->_vptr_FileManager[4])(peVar1,local_48,local_90);
  std::filesystem::__cxx11::path::~path(this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::filesystem::__cxx11::path::~path(this_01);
  std::__cxx11::string::~string((string *)&local_68);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1fde98);
  return;
}

Assistant:

virtual void resetWith(SingleFileIndexedStorage<T, IndexT, RegisterInfo> &&other) noexcept {
        getRegister() = std::move(other.getRegister());
        auto thisFileManager = getFileManager();
        assert(other.getFileManager() == thisFileManager);
        thisFileManager->swap(other.getStorageFilePath(), getStorageFilePath());
    }